

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.c
# Opt level: O1

void glfwKeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWEvent *pGVar1;
  
  pGVar1 = glfwEventPush();
  pGVar1->type = GLFWkeyevt;
  (pGVar1->field_2).field_2.field_0.window = window;
  *(int *)((long)&pGVar1->field_2 + 0x10) = key;
  *(int *)((long)&pGVar1->field_2 + 0x14) = scancode;
  *(int *)((long)&pGVar1->field_2 + 0xc) = action;
  *(int *)((long)&pGVar1->field_2 + 8) = mods;
  return;
}

Assistant:

void glfwKeyCallback(GLFWwindow* window, int key, int scancode, int action, int mods) {
  GLFWEvent* event = glfwEventPush();
  event->type = GLFWkeyevt;
  event->window = window;
  event->key = key;
  event->scancode = scancode;
  event->action = action;
  event->mods = mods;
}